

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_skip_bytes_straddle(mpack_reader_t *reader,size_t count)

{
  ulong count_00;
  size_t left;
  size_t count_local;
  mpack_reader_t *reader_local;
  
  if (reader->fill == (mpack_reader_fill_t)0x0) {
    mpack_reader_flag_error(reader,mpack_error_invalid);
  }
  else {
    count_00 = count - ((long)reader->end - (long)reader->data);
    reader->data = reader->end;
    if ((reader->skip == (mpack_reader_skip_t)0x0) || (count_00 <= reader->size >> 4)) {
      mpack_reader_skip_using_fill(reader,count_00);
    }
    else {
      (*reader->skip)(reader,count_00);
    }
  }
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_skip_bytes_straddle(mpack_reader_t* reader, size_t count) {

    // we'll need at least a fill function to skip more data. if there's
    // no fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data. (see mpack_read_native_straddle())
    if (reader->fill == NULL) {
        mpack_log("reader has no fill function!\n");
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return;
    }

    // discard whatever's left in the buffer
    size_t left = (size_t)(reader->end - reader->data);
    mpack_log("discarding %i bytes still in buffer\n", (int)left);
    count -= left;
    reader->data = reader->end;

    // use the skip function if we've got one, and if we're trying
    // to skip a lot of data. if we only need to skip some tiny
    // fraction of the buffer size, it's probably better to just
    // fill the buffer and skip from it instead of trying to seek.
    if (reader->skip && count > reader->size / 16) {
        mpack_log("calling skip function for %i bytes\n", (int)count);
        reader->skip(reader, count);
        return;
    }

    mpack_reader_skip_using_fill(reader, count);
}